

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool Utils::compareClsidType(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,string *clsid)

{
  uint uVar1;
  char *pcVar2;
  int i;
  ulong uVar3;
  
  for (uVar3 = 0;
      (uVar3 != 0x10 &&
      (((uVar1 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar3], uVar1 == 0 &&
        ((clsid->_M_string_length & 0xfffffffffffffffe) == 0xe)) ||
       (pcVar2 = (char *)std::__cxx11::string::at((ulong)clsid), (char)uVar1 == *pcVar2))));
      uVar3 = uVar3 + 1) {
  }
  return 0xf < uVar3;
}

Assistant:

bool Utils::compareClsidType(std::vector<unsigned int> vec, std::string clsid) {
    int j = 0;      // Used for cases when clsid contains \x00 -> I remove all \x00 from clsid-s and it's len = 15 or 14

    for(int i = 0 ; i < 16; ++i) {
        if((vec[i] == 0x00) && (clsid.size() == 15 || clsid.size() == 14))
            continue;

        if((char)vec[i] != (char)clsid.at(j))
            return false;

        ++j;
    }
    return true;
}